

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void wr_monster_memory(void)

{
  monster_lore *pmVar1;
  angband_constants *paVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  wr_byte('\x02');
  lVar4 = 10;
  lVar5 = 0x10;
  paVar2 = z_info;
  for (uVar3 = 0; pmVar1 = l_list, uVar3 < paVar2->r_max; uVar3 = uVar3 + 1) {
    if ((*(char **)(r_info->flags + lVar5 + -0x5c) != (char *)0x0) &&
       ((*(short *)(l_list->flags + lVar4 + -0x22) != 0 ||
        (*(short *)(l_list->flags + lVar4 + -0x20) != 0)))) {
      wr_string(*(char **)(r_info->flags + lVar5 + -0x5c));
      wr_u16b(*(uint16_t *)(pmVar1->flags + lVar4 + -0x22));
      wr_u16b(*(uint16_t *)(pmVar1->flags + lVar4 + -0x20));
      paVar2 = z_info;
    }
    lVar4 = lVar4 + 0x78;
    lVar5 = lVar5 + 0xd0;
  }
  wr_string("No more monsters");
  return;
}

Assistant:

void wr_monster_memory(void)
{
	int r_idx;

	wr_byte(MFLAG_SIZE);

	for (r_idx = 0; r_idx < z_info->r_max; r_idx++) {
		struct monster_race *race = &r_info[r_idx];
		struct monster_lore *lore = &l_list[r_idx];

		/* Names and kill counts */
		if (!race->name || !(lore->pkills || lore->thefts)) continue;
		wr_string(race->name);
		wr_u16b(lore->pkills);
		wr_u16b(lore->thefts);
	}
	wr_string("No more monsters");
}